

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

void time_sleep(double seconds)

{
  int iVar1;
  double in_XMM0_Qa;
  timespec rem;
  timespec ts;
  timespec local_28;
  timespec local_18;
  
  if (0.0 < in_XMM0_Qa) {
    local_18.tv_sec = (__time_t)in_XMM0_Qa;
    local_18.tv_nsec = (long)((in_XMM0_Qa - (double)local_18.tv_sec) * 1000000000.0);
    while (iVar1 = clock_nanosleep(0,0,&local_18,&local_28), iVar1 != 0) {
      local_18.tv_sec = local_28.tv_sec;
      local_18.tv_nsec = local_28.tv_nsec;
    }
  }
  return;
}

Assistant:

void time_sleep(double seconds)
{
   struct timespec ts, rem;

   if (seconds > 0.0)
   {
      ts.tv_sec = seconds;
      ts.tv_nsec = (seconds-(double)ts.tv_sec) * 1E9;

      while (clock_nanosleep(CLOCK_REALTIME, 0, &ts, &rem))
      {
         /* copy remaining time to ts */
         ts.tv_sec  = rem.tv_sec;
         ts.tv_nsec = rem.tv_nsec;
      }
   }
}